

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O2

int __thiscall storage::BTLeafNode::erase_(BTLeafNode *this,int key,Record **out_record,bool *out)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  BTNode *pBVar4;
  BTLeafNode *this_00;
  BTLeafNode *this_01;
  long lVar5;
  bool a_2;
  bool a;
  BTNode *local_50;
  BTNode *local_48;
  int index;
  long local_38;
  
  *out = true;
  index = -1;
  bVar2 = search_record(this,key,out_record,&index);
  if (!bVar2) {
    *out = false;
    return -1;
  }
  iVar3 = (this->super_BTNode).used_links_count_;
  if ((0x19 < iVar3) || ((this->super_BTNode).parent_ == (BTNode *)0x0)) {
    for (lVar5 = (long)index + 0x1d; lVar5 + -0x1c < (long)(iVar3 + -1); lVar5 = lVar5 + 1) {
      (this->super_BTNode).keys_[lVar5 + -0x1d] = (this->super_BTNode).keys_[lVar5 + -0x1c];
      *(undefined8 *)((this->super_BTNode).keys_ + lVar5 * 2 + -7) =
           *(undefined8 *)((this->super_BTNode).keys_ + lVar5 * 2 + -5);
      iVar3 = (this->super_BTNode).used_links_count_;
    }
    (this->super_BTNode).used_links_count_ = iVar3 + -1;
    return -1;
  }
  pBVar4 = BTNode::get_left_brother(&this->super_BTNode);
  if (pBVar4 == (BTNode *)0x0) {
    this_00 = (BTLeafNode *)0x0;
  }
  else {
    this_00 = (BTLeafNode *)__dynamic_cast(pBVar4,&BTNode::typeinfo,&typeinfo,0);
  }
  pBVar4 = BTNode::get_right_brother(&this->super_BTNode);
  if (pBVar4 == (BTNode *)0x0) {
    if (this_00 == (BTLeafNode *)0x0) {
LAB_00104684:
      if ((this->super_BTNode).parent_ == (BTNode *)0x0) {
        return -1;
      }
      __assert_fail("parent_ == nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                    ,0x212,"int storage::BTLeafNode::erase_(int, Record *&, bool &)");
    }
    iVar3 = (this_00->super_BTNode).used_links_count_;
    if (iVar3 < 0x1a) {
LAB_00104572:
      iVar3 = (this->super_BTNode).child_index_;
      lVar5 = 0;
      do {
        if ((long)(this->super_BTNode).used_links_count_ + -1 <= lVar5) {
          this_00->next_ = this->next_;
          return iVar3 + -1;
        }
        iVar1 = (this->super_BTNode).keys_[lVar5];
        if (iVar1 != key) {
          _a = (Record *)((ulong)_a & 0xffffffffffffff00);
          insert_(this_00,iVar1,this->record_links_[lVar5],&a);
          if (a == false) {
            __assert_fail("a",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                          ,0x200,"int storage::BTLeafNode::erase_(int, Record *&, bool &)");
          }
        }
        lVar5 = lVar5 + 1;
      } while( true );
    }
LAB_001044e7:
    local_48 = (this->super_BTNode).parent_;
    local_50 = (BTNode *)(long)(this->super_BTNode).child_index_;
    iVar1 = (this_00->super_BTNode).keys_[iVar3 - 2U];
    _a = (Record *)((ulong)_a & 0xffffffffffffff00);
    insert_(this,iVar1,this_00->record_links_[iVar3 - 2U],&a);
    if (a == false) {
      __assert_fail("a",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                    ,0x1e4,"int storage::BTLeafNode::erase_(int, Record *&, bool &)");
    }
    erase_(this_00,iVar1,out_record,&a);
    if (a == false) {
      __assert_fail("a",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                    ,0x1e6,"int storage::BTLeafNode::erase_(int, Record *&, bool &)");
    }
    erase_(this,key,out_record,out);
    local_48->keys_[(long)local_50 + -1] = iVar1;
  }
  else {
    this_01 = (BTLeafNode *)__dynamic_cast(pBVar4,&BTNode::typeinfo,&typeinfo,0);
    if (this_00 == (BTLeafNode *)0x0) {
      if (this_01 == (BTLeafNode *)0x0) goto LAB_00104684;
      if ((this_01->super_BTNode).used_links_count_ < 0x1a) {
        _a = (Record *)((ulong)_a & 0xffffffffffffff00);
        iVar3 = (this->super_BTNode).child_index_;
        insert_(this,(this_01->super_BTNode).keys_[0],this_01->record_links_[0],&a);
        if (a == false) {
          __assert_fail("a",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                        ,0x208,"int storage::BTLeafNode::erase_(int, Record *&, bool &)");
        }
        erase_(this,key,out_record,out);
        lVar5 = 0x1d;
        do {
          if ((long)(this_01->super_BTNode).used_links_count_ + -1 <= lVar5 + -0x1c) {
            this->next_ = this_01->next_;
            return iVar3;
          }
          insert_(this,(this_01->super_BTNode).keys_[lVar5 + -0x1c],
                  *(Record **)((this_01->super_BTNode).keys_ + lVar5 * 2 + -5),&a);
          lVar5 = lVar5 + 1;
        } while (a != false);
        __assert_fail("a",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                      ,0x20c,"int storage::BTLeafNode::erase_(int, Record *&, bool &)");
      }
    }
    else {
      iVar3 = (this_00->super_BTNode).used_links_count_;
      if (0x19 < iVar3) goto LAB_001044e7;
      if ((this_01 == (BTLeafNode *)0x0) || ((this_01->super_BTNode).used_links_count_ < 0x1a))
      goto LAB_00104572;
    }
    local_50 = (this->super_BTNode).parent_;
    local_38 = (long)(this->super_BTNode).child_index_;
    iVar3 = (this_01->super_BTNode).keys_[0];
    local_48 = (BTNode *)this_01->record_links_[0];
    _a = (Record *)0x0;
    a_2 = false;
    erase_(this_01,iVar3,(Record **)&a,&a_2);
    if (a_2 == false) {
      __assert_fail("a",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                    ,0x1f2,"int storage::BTLeafNode::erase_(int, Record *&, bool &)");
    }
    insert_(this,iVar3,local_48,&a_2);
    if (a_2 == false) {
      __assert_fail("a",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                    ,0x1f5,"int storage::BTLeafNode::erase_(int, Record *&, bool &)");
    }
    erase_(this,key,out_record,out);
    local_50->keys_[local_38] = (this_01->super_BTNode).keys_[0];
  }
  return -1;
}

Assistant:

int BTLeafNode::erase_(int key, Record *&out_record, bool &out) {
        out = true;
        int index = -1;
        if (search_record(key, out_record, index)) {
            if (check_if_erase() || (parent_ == nullptr))               //only need erase
            {
                for (int i = index + 1; i < used_links_count_ - 1; ++i) {
                    keys_[i - 1] = keys_[i];
                    record_links_[i - 1] = record_links_[i];
                }
                used_links_count_--;
            } else {
                BTLeafNode *l = dynamic_cast<BTLeafNode *>(get_left_brother());
                BTLeafNode *r = dynamic_cast<BTLeafNode *>(get_right_brother());
                if (l && l->check_if_erase()) {
                    // move one from left brother
                    int &key_infl = parent_->keys_[child_index_ - 1];

                    int key_move = l->keys_[l->used_links_count_ - 2];
                    Record *record_move = l->record_links_[l->used_links_count_ - 2];

                    bool a = false;
                    insert_(key_move, record_move, a);
                    assert(a);
                    l->erase_(key_move, out_record, a);
                    assert(a);
                    erase_(key, out_record, out);
                    key_infl = key_move;
                } else if (r && r->check_if_erase()) {
                    // move one from right brother
                    int &key_infl = parent_->keys_[child_index_];

                    int key_move = r->keys_[0];
                    Record *record_move = r->record_links_[0];
                    Record *rec = nullptr;
                    bool a = false;
                    r->erase_(key_move, rec, a);
                    assert(a);

                    insert_(key_move, record_move, a);
                    assert(a);
                    erase_(key, out_record, out);
                    key_infl = r->keys_[0];
                } else {
                    if (l) {
                        int idx = child_index_ - 1;
                        for (int i = 0; i < used_links_count_ - 1; ++i) {
                            if (keys_[i] == key)
                                continue;
                            bool a = false;
                            l->insert_(keys_[i], record_links_[i], a);
                            assert(a);
                        }
                        l->next_ = this->next_;
                        return idx;
                    } else if (r) {
                        bool a = false;
                        int idx = child_index_;
                        insert_(r->keys_[0], r->record_links_[0], a);
                        assert(a);
                        erase_(key, out_record, out);
                        for (int i = 1; i < r->used_links_count_ - 1; ++i) {
                            insert_(r->keys_[i], r->record_links_[i], a);
                            assert(a);
                        }
                        this->next_ = r->next_;
                        return idx;
                    } else {
                        // this must be a root
                        assert(parent_ == nullptr);
                    }
                }
            }
        } else {
            out = false;
        }
        return -1;
    }